

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
               (void)

{
  Underlying_matrix *this;
  Column *col;
  Index columnIndex;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *b;
  pointer witness;
  shared_count sStack_1d8;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  undefined **local_1b8;
  undefined1 local_1b0;
  _Base_ptr local_1a8;
  char *local_1a0;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_118;
  char *local_110;
  char *local_d8;
  char *local_d0;
  undefined1 *local_c8;
  undefined1 *local_c0;
  char *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  char *local_98;
  char *local_90;
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>
  ::
  Matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>
              *)&m,&columns,5);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>
            (&columns,&m);
  this = &m.matrix_;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>
  ::remove_column(this,2);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>
  ::remove_column(this,4);
  local_98 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_90 = "";
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_98,0x341);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>
  ::_get_column(this,2);
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b0 = "";
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b8,0x341);
  sStack_1d8.pi_ = (sp_counted_base *)0x0;
  local_1b0 = _S_red;
  local_1b8 = &PTR__lazy_ostream_001aa7f8;
  local_1a8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1a0 = "exception std::logic_error expected but not raised";
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1d8);
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_110 = "";
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x342);
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>
  ::_get_column(this,4);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x342);
  sStack_1d8.pi_ = (sp_counted_base *)0x0;
  local_1b0 = _S_red;
  local_1b8 = &PTR__lazy_ostream_001aa7f8;
  local_1a8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1a0 = "exception std::logic_error expected but not raised";
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1d8);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::erase(&columns,columns.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 4);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::erase(&columns,columns.
                   super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2);
  columnIndex = 0;
  for (witness = columns.
                 super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      witness !=
      columns.
      super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; witness = witness + 1) {
    if ((columnIndex == 4) || (columnIndex == 2)) {
      columnIndex = columnIndex | 1;
    }
    col = Gudhi::persistence_matrix::
          Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>
          ::_get_column(this,columnIndex);
    get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
              ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>
                *)&local_1b8,col);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true,false>>>>
              (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>_>_>
                        *)&local_1b8);
    columnIndex = columnIndex + 1;
    std::
    _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *)&local_1b8);
  }
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}